

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

void __thiscall cfd::Psbt::Psbt(Psbt *this,uint32_t psbt_version,TransactionContext *context)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_578;
  long local_560;
  long local_558;
  OutPoint local_548;
  UtxoData local_520;
  
  cfd::core::Transaction::Transaction((Transaction *)&local_520,&context->super_Transaction);
  cfd::core::Psbt::Psbt(&this->super_Psbt,psbt_version,(Transaction *)&local_520);
  core::Transaction::~Transaction((Transaction *)&local_520);
  *(undefined ***)this = &PTR__Psbt_002b3200;
  p_Var1 = &(this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_578.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_578.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_578.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cfd::core::Transaction::GetTxInList();
  if (local_560 != local_558) {
    lVar2 = local_560;
    do {
      cfd::core::OutPoint::OutPoint(&local_548,(Txid *)(lVar2 + 8),*(uint *)(lVar2 + 0x28));
      TransactionContext::GetTxInUtxoData(&local_520,context,&local_548);
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::emplace_back<cfd::UtxoData>
                (&local_578,&local_520);
      UtxoData::~UtxoData(&local_520);
      local_548.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b2f00;
      if (local_548.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_548.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar2 = lVar2 + 0x90;
    } while (lVar2 != local_558);
  }
  std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
            ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
             &local_560);
  CollectInputUtxo(this,&local_578);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_578);
  return;
}

Assistant:

Psbt::Psbt(uint32_t psbt_version, const TransactionContext& context)
    : cfd::core::Psbt(psbt_version, static_cast<const Transaction>(context)) {
  std::vector<UtxoData> utxo_list;
  for (const auto& txin : context.GetTxInList()) {
    utxo_list.push_back(context.GetTxInUtxoData(txin.GetOutPoint()));
  }
  CollectInputUtxo(utxo_list);
}